

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O1

void __thiscall CMU462::DynamicScene::Scene::selectHalfedge(Scene *this)

{
  HalfedgeElement *pHVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  
  pHVar1 = (this->selected).element;
  if (pHVar1 != (HalfedgeElement *)0x0) {
    lVar2 = __dynamic_cast(pHVar1,&HalfedgeElement::typeinfo,&Face::typeinfo,0);
    lVar3 = __dynamic_cast(pHVar1,&HalfedgeElement::typeinfo,&Edge::typeinfo,0);
    lVar4 = __dynamic_cast(pHVar1,&HalfedgeElement::typeinfo,&Vertex::typeinfo,0);
    if (lVar2 == 0) {
      if (lVar3 == 0) {
        if (lVar4 == 0) {
          return;
        }
        plVar5 = (long *)(lVar4 + 0xe8);
      }
      else {
        plVar5 = (long *)(lVar3 + 0x58);
      }
    }
    else {
      plVar5 = (long *)(lVar2 + 0xa8);
    }
    (this->selected).element = (HalfedgeElement *)(*plVar5 + 0x10);
  }
  return;
}

Assistant:

void Scene::selectHalfedge() {
  if (selected.element) {
    Face *f = selected.element->getFace();
    Edge *e = selected.element->getEdge();
    Vertex *v = selected.element->getVertex();
    HalfedgeIter h;
    if (f != nullptr) {
      h = f->halfedge();
    } else if (e != nullptr) {
      h = e->halfedge();
    } else if (v != nullptr) {
      h = v->halfedge();
    } else {
      return;
    }
    selected.element = elementAddress(h);
  }
}